

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utlru_cache.hpp
# Opt level: O1

void __thiscall
cappuccino::
utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::do_update(utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
            *this,keyed_iterator keyed_position,
           basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
           time_point expire_time)

{
  list<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  pointer peVar1;
  uint in_EAX;
  __off64_t *in_R8;
  size_t in_R9;
  uint in_stack_00000008;
  
  peVar1 = (this->m_elements).
           super__Vector_base<cappuccino::utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
           ._M_impl.super__Vector_impl_data._M_start +
           *(long *)((long)keyed_position.
                           super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                           ._M_cur + 0x10);
  (peVar1->m_expire_time).__d.__r = (rep)expire_time.__d.__r;
  std::__cxx11::string::operator=((string *)&peVar1->m_value,(string *)value);
  this_00 = &this->m_ttl_list;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::splice
            (this_00,(int)this_00,(__off64_t *)this_00,(int)(peVar1->m_ttl_position)._M_node,in_R8,
             in_R9,in_EAX);
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::splice
            (&this->m_lru_list,
             (int)(this->m_lru_list).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl._M_node.super__List_node_base._M_next,(__off64_t *)&this->m_lru_list,
             (int)(peVar1->m_lru_position)._M_node,in_R8,in_R9,in_stack_00000008);
  return;
}

Assistant:

auto do_update(keyed_iterator keyed_position, value_type&& value, std::chrono::steady_clock::time_point expire_time)
        -> void
    {
        size_t element_idx = keyed_position->second;

        element& e      = m_elements[element_idx];
        e.m_expire_time = expire_time;
        e.m_value       = std::move(value);

        // push to the end of the ttl list
        m_ttl_list.splice(m_ttl_list.end(), m_ttl_list, e.m_ttl_position);

        do_access(e);
    }